

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int ffrtnm(char *url,char *rootname,int *status)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  char *__s;
  long lVar6;
  ulong uVar7;
  ushort **ppuVar8;
  size_t sVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  char *pcVar16;
  char urltype [20];
  char infile [1025];
  char local_458 [8];
  undefined2 auStack_450 [11];
  char acStack_43a [1034];
  
  if (0 < *status) {
    return *status;
  }
  *rootname = '\0';
  local_458[0] = '\0';
  acStack_43a[2] = 0;
  if (*url == '-') {
    sVar3 = strlen(local_458);
    (local_458 + sVar3)[0] = '-';
    (local_458 + sVar3)[1] = '\0';
    pcVar16 = url + 1;
  }
  else {
    iVar2 = strncmp(url,"stdin",5);
    if ((iVar2 == 0) || (iVar2 = strncmp(url,"STDIN",5), iVar2 == 0)) {
      sVar3 = strlen(local_458);
      (local_458 + sVar3)[0] = '-';
      (local_458 + sVar3)[1] = '\0';
LAB_0012fda9:
      pcVar16 = url + 5;
    }
    else {
      pcVar4 = strstr(url,"://");
      pcVar5 = strchr(url,0x28);
      pcVar16 = (char *)0x0;
      if (pcVar4 <= pcVar5) {
        pcVar16 = pcVar4;
      }
      if (pcVar5 == (char *)0x0) {
        pcVar16 = pcVar4;
      }
      if (pcVar16 == (char *)0x0) {
        iVar2 = strncmp(url,"ftp:",4);
        if (iVar2 == 0) {
          sVar3 = strlen(local_458);
          builtin_strncpy(local_458 + sVar3,"ftp:",4);
LAB_001300a8:
          builtin_strncpy(local_458 + sVar3 + 3,"://",4);
          pcVar16 = url + 4;
        }
        else {
          iVar2 = strncmp(url,"gsiftp:",7);
          if (iVar2 == 0) {
            sVar3 = strlen(local_458);
            builtin_strncpy(local_458 + sVar3,"gsiftp:/",8);
            *(undefined2 *)((long)auStack_450 + sVar3) = 0x2f;
            pcVar16 = url + 7;
          }
          else {
            iVar2 = strncmp(url,"http:",5);
            if (iVar2 == 0) {
              sVar3 = strlen(local_458);
              builtin_strncpy(local_458 + sVar3,"http://",8);
              goto LAB_0012fda9;
            }
            iVar2 = strncmp(url,"mem:",4);
            if (iVar2 == 0) {
              sVar3 = strlen(local_458);
              builtin_strncpy(local_458 + sVar3,"mem:",4);
              goto LAB_001300a8;
            }
            iVar2 = strncmp(url,"shmem:",6);
            if (iVar2 == 0) {
              sVar3 = strlen(local_458);
              builtin_strncpy(local_458 + sVar3,"shmem://",8);
              *(undefined1 *)((long)auStack_450 + sVar3) = 0;
              pcVar16 = url + 6;
            }
            else {
              iVar2 = strncmp(url,"file:",5);
              pcVar16 = url + (ulong)(iVar2 == 0) * 5;
            }
          }
        }
      }
      else {
        if (0x10 < (long)pcVar16 - (long)url) goto LAB_0012ffad;
        strncat(local_458,url,((long)pcVar16 - (long)url) + 3);
        pcVar16 = pcVar16 + 3;
      }
    }
  }
  pcVar4 = strchr(pcVar16,0x28);
  pcVar5 = strchr(pcVar16,0x5b);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    __s = strchr(pcVar4,0x29);
    if (__s != (char *)0x0) {
      while( true ) {
        do {
          cVar1 = __s[1];
          __s = __s + 1;
        } while (cVar1 == ' ');
        if ((cVar1 == '\0') || (cVar1 == '[')) break;
        pcVar4 = strchr(pcVar4 + 1,0x28);
        __s = strchr(__s,0x29);
        if ((__s == (char *)0x0) || (pcVar4 == (char *)0x0)) break;
      }
    }
  }
  if (pcVar4 == pcVar5) {
    sVar3 = strlen(pcVar16);
    if (0x400 < sVar3) goto LAB_0012ffad;
    strcat(acStack_43a + 2,pcVar16);
  }
  else if ((pcVar5 == (char *)0x0) || (pcVar4 < pcVar5 && pcVar4 != (char *)0x0)) {
    if (0x400 < (long)pcVar4 - (long)pcVar16) goto LAB_0012ffad;
    strncat(acStack_43a + 2,pcVar16,(long)pcVar4 - (long)pcVar16);
    pcVar16 = strchr(pcVar4 + 1,0x29);
    if (pcVar16 == (char *)0x0) goto LAB_0012ffad;
  }
  else {
    if (0x400 < (long)pcVar5 - (long)pcVar16) goto LAB_0012ffad;
    strncat(acStack_43a + 2,pcVar16,(long)pcVar5 - (long)pcVar16);
  }
  sVar3 = strlen(acStack_43a + 2);
  if (1 < (int)(uint)sVar3) {
    lVar6 = (ulong)((uint)sVar3 & 0x7fffffff) + 1;
    do {
      if (acStack_43a[lVar6] != ' ') break;
      acStack_43a[lVar6] = '\0';
      lVar6 = lVar6 + -1;
    } while (2 < lVar6);
  }
  sVar3 = strlen(acStack_43a + 2);
  uVar15 = (uint)sVar3;
  uVar7 = sVar3 & 0xffffffff;
  uVar10 = (int)uVar15 >> 0x1f & uVar15;
  uVar14 = sVar3 & 0xffffffff;
  do {
    uVar7 = uVar7 - 1;
    uVar12 = (uint)uVar14;
    uVar11 = uVar10;
    uVar13 = uVar10 - 1;
    if ((int)uVar12 < 1) break;
    uVar13 = uVar12 - 1;
    uVar14 = (ulong)uVar13;
    uVar11 = uVar12;
  } while (acStack_43a[(uVar7 & 0xffffffff) + 2] != '+');
  if ((int)(uVar15 - uVar13) < 5 && 1 < (int)uVar11) {
    uVar10 = uVar11;
    if ((int)uVar11 < (int)uVar15) {
      ppuVar8 = __ctype_b_loc();
      pcVar16 = acStack_43a + (ulong)uVar11 + 2;
      do {
        uVar10 = uVar11;
        if ((*(byte *)((long)*ppuVar8 + (long)*pcVar16 * 2 + 1) & 8) == 0) break;
        uVar11 = uVar11 + 1;
        pcVar16 = pcVar16 + 1;
        uVar10 = uVar15;
      } while ((int)uVar11 < (int)uVar15);
    }
    if (uVar10 == uVar15) {
      acStack_43a[(ulong)uVar13 + 2] = '\0';
    }
  }
  sVar3 = strlen(local_458);
  sVar9 = strlen(acStack_43a + 2);
  if (sVar9 + sVar3 < 0x401) {
    strcat(rootname,local_458);
    strcat(rootname,acStack_43a + 2);
    return *status;
  }
LAB_0012ffad:
  *status = 0x7d;
  return 0x7d;
}

Assistant:

int ffrtnm(char *url, 
           char *rootname,
           int *status)
/*
   parse the input URL, returning the root name (filetype://basename).
*/

{ 
    int ii, jj, slen, infilelen;
    char *ptr1, *ptr2, *ptr3, *ptr4;
    char urltype[MAX_PREFIX_LEN];
    char infile[FLEN_FILENAME];

    if (*status > 0)
        return(*status);

    ptr1 = url;
    *rootname = '\0';
    *urltype = '\0';
    *infile  = '\0';

    /*  get urltype (e.g., file://, ftp://, http://, etc.)  */
    if (*ptr1 == '-')        /* "-" means read file from stdin */
    {
        strcat(urltype, "-");
        ptr1++;
    }
    else if (!strncmp(ptr1, "stdin", 5) || !strncmp(ptr1, "STDIN", 5))
    {
        strcat(urltype, "-");
        ptr1 = ptr1 + 5;
    }
    else
    {
        ptr2 = strstr(ptr1, "://");
        ptr3 = strstr(ptr1, "(" );

        if (ptr3 && (ptr3 < ptr2) )
        {
           /* the urltype follows a '(' character, so it must apply */
           /* to the output file, and is not the urltype of the input file */
           ptr2 = 0;   /* so reset pointer to zero */
        }


        if (ptr2)                  /* copy the explicit urltype string */ 
        {

	   if (ptr2 - ptr1 + 3 > MAX_PREFIX_LEN - 1)
	   {
               return(*status = URL_PARSE_ERROR);
           }
            strncat(urltype, ptr1, ptr2 - ptr1 + 3);
            ptr1 = ptr2 + 3;
        }
        else if (!strncmp(ptr1, "ftp:", 4) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "ftp://");
            ptr1 += 4;
        }
        else if (!strncmp(ptr1, "gsiftp:", 7) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "gsiftp://");
            ptr1 += 7;
        }
        else if (!strncmp(ptr1, "http:", 5) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "http://");
            ptr1 += 5;
        }
        else if (!strncmp(ptr1, "mem:", 4) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "mem://");
            ptr1 += 4;
        }
        else if (!strncmp(ptr1, "shmem:", 6) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "shmem://");
            ptr1 += 6;
        }
        else if (!strncmp(ptr1, "file:", 5) )
        {                              /* the 2 //'s are optional */
            ptr1 += 5;
        }

        /* else assume file driver    */
    }
 
       /*  get the input file name  */
    ptr2 = strchr(ptr1, '(');   /* search for opening parenthesis ( */
    ptr3 = strchr(ptr1, '[');   /* search for opening bracket [ */
    if (ptr2)
    {
       ptr4 = strchr(ptr2, ')');
       while (ptr4 && ptr2)
       {
          do {
             ++ptr4;
          }  while (*ptr4 == ' ');
          if (*ptr4 == 0 || *ptr4 == '[')
             break;
          ptr2 = strchr(ptr2+1, '(');
          ptr4 = strchr(ptr4, ')');
       }
    }

    if (ptr2 == ptr3)  /* simple case: no [ or ( in the file name */
    {

	if (strlen(ptr1) > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR);
        }

        strcat(infile, ptr1);
    }
    else if (!ptr3)     /* no bracket, so () enclose output file name */
    {

	if (ptr2 - ptr1 > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR);
        }

        strncat(infile, ptr1, ptr2 - ptr1);
        ptr2++;

        ptr1 = strchr(ptr2, ')' );   /* search for closing ) */
        if (!ptr1)
            return(*status = URL_PARSE_ERROR);  /* error, no closing ) */

    }
    else if (ptr2 && (ptr2 < ptr3)) /* () enclose output name before bracket */
    {

	if (ptr2 - ptr1 > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR); 
        }

        strncat(infile, ptr1, ptr2 - ptr1);
        ptr2++;

        ptr1 = strchr(ptr2, ')' );   /* search for closing ) */
        if (!ptr1)
            return(*status = URL_PARSE_ERROR);  /* error, no closing ) */
    }
    else    /*   bracket comes first, so there is no output name */
    {
	if (ptr3 - ptr1 > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR); 
        }

        strncat(infile, ptr1, ptr3 - ptr1);
    }

       /* strip off any trailing blanks in the names */
    slen = strlen(infile);
    for (ii = slen - 1; ii > 0; ii--)   
    {
        if (infile[ii] == ' ')
            infile[ii] = '\0';
        else
            break;
    }

    /* --------------------------------------------- */
    /* check if the 'filename+n' convention has been */
    /* used to specifiy which HDU number to open     */ 
    /* --------------------------------------------- */

    jj = strlen(infile);

    for (ii = jj - 1; ii >= 0; ii--)
    {
        if (infile[ii] == '+')    /* search backwards for '+' sign */
            break;
    }

    if (ii > 0 && (jj - ii) < 5)  /* limit extension numbers to 4 digits */
    {
        infilelen = ii;
        ii++;


        for (; ii < jj; ii++)
        {
            if (!isdigit((int) infile[ii] ) ) /* are all the chars digits? */
                break;
        }

        if (ii == jj)      
        {
             /* yes, the '+n' convention was used.  */

             infile[infilelen] = '\0'; /* delete the extension number */
        }
    }

    if (strlen(urltype) + strlen(infile) > FLEN_FILENAME - 1)
    {
            return(*status = URL_PARSE_ERROR); 
    }

    strcat(rootname, urltype);  /* construct the root name */
    strcat(rootname, infile);

    return(*status);
}